

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib553.c
# Opt level: O3

size_t myreadfunc(void *ptr,size_t size,size_t nmemb,void *stream)

{
  size_t sVar1;
  ulong __n;
  
  memset(myreadfunc::buf,0x41,0x400);
  sVar1 = myreadfunc::total;
  __n = size * nmemb;
  if (myreadfunc::total <= size * nmemb) {
    __n = myreadfunc::total;
  }
  if (0x3ff < __n) {
    __n = 0x400;
  }
  memcpy(ptr,myreadfunc::buf,__n);
  myreadfunc::total = sVar1 - __n;
  return __n;
}

Assistant:

static size_t myreadfunc(void *ptr, size_t size, size_t nmemb, void *stream)
{
  static size_t total = POSTLEN;
  static char buf[1024];
  (void)stream;

  memset(buf, 'A', sizeof(buf));

  size *= nmemb;
  if(size > total)
    size = total;

  if(size > sizeof(buf))
    size = sizeof(buf);

  memcpy(ptr, buf, size);
  total -= size;
  return size;
}